

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::~FConfigFile(FConfigFile *this)

{
  FConfigSection *pFVar1;
  FConfigEntry *pFVar2;
  FConfigSection *this_00;
  FConfigEntry *pFVar3;
  
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_00845710;
  this_00 = this->Sections;
  while (this_00 != (FConfigSection *)0x0) {
    pFVar1 = this_00->Next;
    pFVar3 = this_00->RootEntry;
    while (pFVar3 != (FConfigEntry *)0x0) {
      pFVar2 = pFVar3->Next;
      if (pFVar3->Value != (char *)0x0) {
        operator_delete__(pFVar3->Value);
      }
      operator_delete__(pFVar3);
      pFVar3 = pFVar2;
    }
    FString::~FString(&this_00->Note);
    FString::~FString(&this_00->SectionName);
    operator_delete(this_00,0x28);
    this_00 = pFVar1;
  }
  FString::~FString(&this->PathName);
  return;
}

Assistant:

FConfigFile::~FConfigFile ()
{
	FConfigSection *section = Sections;

	while (section != NULL)
	{
		FConfigSection *nextsection = section->Next;
		FConfigEntry *entry = section->RootEntry;

		while (entry != NULL)
		{
			FConfigEntry *nextentry = entry->Next;
			delete[] entry->Value;
			delete[] (char *)entry;
			entry = nextentry;
		}
		delete section;
		section = nextsection;
	}
}